

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::info(QDockAreaLayoutInfo *this,QList<int> *path)

{
  uint uVar1;
  QDockAreaLayoutInfo *this_00;
  pointer pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(path->d).ptr;
  uVar3 = (ulong)((int)uVar1 >> 0x1f ^ uVar1);
  if ((uVar3 < (ulong)(this->item_list).d.size) && ((path->d).size != 1)) {
    pQVar2 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    if (pQVar2[uVar3].subinfo != (QDockAreaLayoutInfo *)0x0) {
      pQVar2 = QList<QDockAreaLayoutItem>::data(&this->item_list);
      this_00 = pQVar2[uVar3].subinfo;
      QList<int>::mid((QList<int> *)&local_40,path,1,-1);
      this = info(this_00,(QList<int> *)&local_40);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayoutInfo::info(const QList<int> &path)
{
    int index = path.first();
    if (index < 0)
        index = -index - 1;
    if (index >= item_list.size())
        return this;
    if (path.size() == 1 || item_list[index].subinfo == nullptr)
        return this;
    return item_list[index].subinfo->info(path.mid(1));
}